

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

void __thiscall
TDeletingArray<FListMenuItem_*,_FListMenuItem_*>::~TDeletingArray
          (TDeletingArray<FListMenuItem_*,_FListMenuItem_*> *this)

{
  FListMenuItem *pFVar1;
  uint i;
  ulong uVar2;
  
  for (uVar2 = 0; uVar2 < (this->super_TArray<FListMenuItem_*,_FListMenuItem_*>).Count;
      uVar2 = uVar2 + 1) {
    pFVar1 = (this->super_TArray<FListMenuItem_*,_FListMenuItem_*>).Array[uVar2];
    if (pFVar1 != (FListMenuItem *)0x0) {
      (*pFVar1->_vptr_FListMenuItem[1])();
    }
  }
  TArray<FListMenuItem_*,_FListMenuItem_*>::~TArray
            (&this->super_TArray<FListMenuItem_*,_FListMenuItem_*>);
  return;
}

Assistant:

~TDeletingArray<T, TT> ()
	{
		for (unsigned int i = 0; i < TArray<T,TT>::Size(); ++i)
		{
			if ((*this)[i] != NULL) 
				delete (*this)[i];
		}
	}